

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ENDF.hpp
# Opt level: O2

void njoy::tools::disco::ENDF::write<double,std::back_insert_iterator<std::__cxx11::string>>
               (double value,
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *it)

{
  uint *puVar1;
  bool bVar2;
  ostringstream *this;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  __type_conflict1 __x;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_210;
  double local_1f8;
  string local_1c8 [8];
  long local_1c0;
  ostringstream buffer;
  long local_1a0 [2];
  uint auStack_190 [88];
  
  this = (ostringstream *)&buffer;
  std::__cxx11::ostringstream::ostringstream(this);
  if (ABS(value) == INFINITY) {
    *(uint *)((long)auStack_190 + *(long *)(_buffer + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(_buffer + -0x18)) & 0xffffff4f | 0x80;
    *(undefined8 *)((long)local_1a0 + *(long *)(_buffer + -0x18) + 8) = 0xb;
    pcVar4 = "Inf";
    if (value < 0.0) {
      pcVar4 = "-Inf";
    }
    std::operator<<((ostream *)&buffer,pcVar4);
    goto LAB_0012e6da;
  }
  dVar12 = ABS(value);
  local_210 = 1.0;
  iVar3 = 0;
  iVar6 = 2;
  local_1f8 = value;
  if ((value != 0.0) || (NAN(value))) {
    dVar9 = log10(dVar12);
    dVar9 = floor(dVar9);
    iVar7 = (int)dVar9;
    if (iVar7 != 0) {
      local_210 = pow(10.0,(double)iVar7);
      local_1f8 = value / local_210;
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      __x = std::log10<int>(iVar6);
      dVar9 = floor(__x);
      iVar6 = (int)dVar9 + 2;
      iVar3 = iVar7;
    }
  }
  iVar7 = 0xb;
  uVar8 = 8 - iVar6;
  dVar9 = pow(10.0,(double)uVar8);
  dVar10 = round(local_1f8 * dVar9);
  dVar10 = dVar10 / dVar9;
  if ((dVar12 < 0.1) || (10000000000.0 <= dVar12)) {
LAB_0012e5d3:
    iVar7 = 0xb - iVar6;
    if (10.0 <= ABS(dVar10)) {
      local_1f8 = *(double *)(&DAT_00184120 + (ulong)(0.0 <= dVar10) * 8);
      iVar3 = iVar3 + 1;
      if (iVar3 == 10) {
        iVar3 = 10;
        iVar7 = 10 - iVar6;
        uVar8 = 7 - iVar6;
      }
      bVar2 = false;
    }
    else {
      bVar2 = false;
      local_1f8 = dVar10;
    }
  }
  else {
    dVar12 = round(value * 100000000.0);
    if ((local_210 * dVar10 == dVar12 / 100000000.0) &&
       (!NAN(local_210 * dVar10) && !NAN(dVar12 / 100000000.0))) goto LAB_0012e5d3;
    dVar12 = pow(10.0,(double)iVar6);
    dVar11 = floor(ABS(local_1f8) * dVar9);
    dVar9 = (ABS(local_1f8) * dVar9 - dVar11) * dVar12;
    if ((dVar9 < 0.5) || (dVar12 + -0.5 < dVar9)) goto LAB_0012e5d3;
    bVar2 = true;
    uVar8 = 0;
    if (iVar3 < 9) {
      uVar8 = 8 - iVar3;
      if (iVar3 < 1) {
        uVar8 = 8;
      }
    }
  }
  *(long *)((long)local_1a0 + *(long *)(_buffer + -0x18) + 8) = (long)iVar7;
  *(uint *)((long)auStack_190 + *(long *)(_buffer + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_buffer + -0x18)) & 0xfffffefb | 4;
  puVar1 = (uint *)((long)auStack_190 + *(long *)(_buffer + -0x18));
  *puVar1 = *puVar1 | 0x400;
  *(uint *)((long)auStack_190 + *(long *)(_buffer + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(_buffer + -0x18)) & 0xffffff4f | 0x80;
  *(long *)((long)local_1a0 + *(long *)(_buffer + -0x18)) = (long)(int)uVar8;
  if (bVar2) {
    if (uVar8 != 0) {
      std::ostream::_M_insert<double>(value);
      goto LAB_0012e6da;
    }
    iVar3 = (int)value;
  }
  else {
    this = (ostringstream *)std::ostream::_M_insert<double>(local_1f8);
    *(uint *)((ostream *)this + *(long *)(*(long *)this + -0x18) + 0x18) =
         *(uint *)((ostream *)this + *(long *)(*(long *)this + -0x18) + 0x18) | 0x800;
  }
  std::ostream::operator<<(this,iVar3);
LAB_0012e6da:
  std::__cxx11::stringbuf::str();
  for (lVar5 = 0; local_1c0 != lVar5; lVar5 = lVar5 + 1) {
    std::__cxx11::string::push_back((char)it->container);
  }
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&buffer);
  return;
}

Assistant:

static void write( Representation value, Iterator& it ) {

    const double absValue = std::abs( value );
    std::ostringstream buffer;

    if ( absValue == std::numeric_limits< Representation >::infinity() ) {

      buffer << std::right << std::setw( w );
      if ( value < 0 ) {

        buffer << "-Inf";
      }
      else {

        buffer << "Inf";
      }
    }
    else {

      // decompose value
      double significand = value;
      double tenToExponent = 1.;
      int exponent = 0;
      int expWidth = minExpWidth;
      if ( value != 0.0 ) {

        // log10(significand 10^exponent) = exponent + log10(significand) and
        // log10(significand) is within [0,1[ so that exponent is given by the
        // floor value
        exponent = static_cast< int >( std::floor( std::log10( absValue ) ) );

        if ( 0 != exponent ) {

          tenToExponent = std::pow( 10.0, exponent );
          significand /= tenToExponent;
          expWidth += static_cast< int >(
              std::floor( std::log10( std::abs( exponent ) ) ) );
        }
      }

      unsigned int width = w - expWidth;
      unsigned int precision = width - excluded;
      bool fixed = false;

      const double tenToPrecision = std::pow( 10.0, precision );
      const double rssignificand = std::round( significand * tenToPrecision )
                                   / tenToPrecision;

      // only check for fixed when the value is in [minFixed,maxFixed[
      if ( ( minFixed <= absValue ) and ( absValue < maxFixed ) ) {

        const double tenToFixedPrecision = std::pow( 10.0, precision + expWidth );
        const double rsreal = rssignificand * tenToExponent;
        const double rfreal = std::round( value * tenToFixedPrecision )
                              / tenToFixedPrecision;

        // only continue if fixed notation would not produce the same value
        if ( rsreal != rfreal ) {

          double max = std::pow( 10.0, expWidth );
          double remainder = std::abs( significand ) * tenToPrecision;
          remainder -= std::floor( remainder );
          remainder *= max;

          if ( ( roundoff <= remainder ) and ( remainder <= max - roundoff ) ) {

            fixed = true;
            precision += expWidth;
            width += expWidth;

            if ( exponent > static_cast< int >( precision ) ) {

              precision = 0;
            }
            else if ( 0 < exponent ) {

              precision -= exponent;
            }
          }
        }
      }

      // due to roundoff, we sometimes produce 10.+x values instead of 1.+(x+1)
      if ( not fixed ) {

        significand = rssignificand;
        if ( std::abs( rssignificand ) >= 10. ) {

          significand = significand >= 0. ? 1. : -1.;
          exponent += 1;
          if ( exponent == 10 ) {

            width -= 1;
            precision -= 1;
          }
        }
      }

      buffer << std::setw( width ) << std::fixed << std::showpoint
             << std::right << std::setprecision( precision );
      if ( fixed ) {

        if ( 0 == precision ) {

          buffer << static_cast< int >( value );
        }
        else {

          buffer << value;
        }
      }
      else {

        buffer << significand << std::showpos << exponent;
      }
    }

    for ( auto b : buffer.str() ) {

      *it++ = b;
    }
  }